

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O3

int X509_VERIFY_PARAM_set1_policies(X509_VERIFY_PARAM *param,stack_st_ASN1_OBJECT *policies)

{
  uint uVar1;
  OPENSSL_STACK *pOVar2;
  
  if (param != (X509_VERIFY_PARAM *)0x0) {
    OPENSSL_sk_pop_free_ex
              (*(OPENSSL_STACK **)&param->purpose,sk_ASN1_OBJECT_call_free_func,ASN1_OBJECT_free);
    if (policies == (stack_st_ASN1_OBJECT *)0x0) {
      param->purpose = 0;
      param->trust = 0;
      uVar1 = 1;
    }
    else {
      pOVar2 = OPENSSL_sk_deep_copy
                         ((OPENSSL_STACK *)policies,sk_ASN1_OBJECT_call_copy_func,OBJ_dup,
                          sk_ASN1_OBJECT_call_free_func,ASN1_OBJECT_free);
      *(OPENSSL_STACK **)&param->purpose = pOVar2;
      uVar1 = (uint)(pOVar2 != (OPENSSL_STACK *)0x0);
    }
    return uVar1;
  }
  return 0;
}

Assistant:

int X509_VERIFY_PARAM_set1_policies(X509_VERIFY_PARAM *param,
                                    const STACK_OF(ASN1_OBJECT) *policies) {
  if (!param) {
    return 0;
  }

  sk_ASN1_OBJECT_pop_free(param->policies, ASN1_OBJECT_free);
  if (!policies) {
    param->policies = NULL;
    return 1;
  }

  param->policies =
      sk_ASN1_OBJECT_deep_copy(policies, OBJ_dup, ASN1_OBJECT_free);
  if (!param->policies) {
    return 0;
  }

  return 1;
}